

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall
CoreTest_IsEnumConvertibleToInt_Test::TestBody(CoreTest_IsEnumConvertibleToInt_Test *this)

{
  undefined1 uVar1;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  AssertionResult *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar_;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  string local_58 [8];
  char *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_18;
  
  this_00 = &local_18;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             SUB81((ulong)this_00 >> 0x38,0));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
    testing::internal::AssertHelper::operator=(in_stack_00000020,(Message *)in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffffa0));
    std::__cxx11::string::~string(local_58);
    testing::Message::~Message((Message *)0x1236d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123732);
  return;
}

Assistant:

TEST(CoreTest, IsEnumConvertibleToInt) {
  EXPECT_TRUE((fmt::convert_to_int<enum_with_underlying_type, char>::value));
}